

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gate.c
# Opt level: O2

int gate_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  uint32_t i;
  ulong uVar3;
  float fVar4;
  float fVar5;
  uint32_t samples;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float *in;
  float *local_30;
  
  puVar2 = (undefined8 *)segment->data;
  fVar5 = *(float *)(puVar2 + 5);
  local_3c = *(float *)(puVar2 + 2);
  local_40 = *(float *)((long)puVar2 + 0x14);
  local_44 = *(float *)(puVar2 + 3);
  local_48 = *(float *)((long)puVar2 + 0x1c);
  local_4c = *(float *)(puVar2 + 4);
  samples = 0xffffffff;
  local_50 = (float)(1.0 / (double)*(uint *)((long)puVar2 + 0x24));
  buffer = (mixed_buffer *)*puVar2;
  buffer_00 = (mixed_buffer *)puVar2[1];
  mixed_buffer_request_read(&in,&samples,buffer);
  if (buffer == buffer_00) {
    fVar4 = 1.0;
    for (uVar3 = 0; samples != uVar3; uVar3 = uVar3 + 1) {
      fVar1 = in[uVar3];
      switch(*(undefined4 *)((long)puVar2 + 0x2c)) {
      case 1:
        fVar4 = 0.0;
        if (local_40 <= fVar1) {
          *(undefined4 *)((long)puVar2 + 0x2c) = 2;
LAB_00139861:
          fVar4 = 0.0;
          fVar5 = 0.0;
        }
        break;
      case 2:
        if (fVar5 <= local_44) {
          fVar4 = fVar5 / local_44;
          fVar5 = fVar5 + local_50;
        }
        else {
LAB_0013981e:
          *(undefined4 *)((long)puVar2 + 0x2c) = 3;
        }
        break;
      case 3:
        if (fVar1 < local_3c) {
          *(undefined4 *)((long)puVar2 + 0x2c) = 4;
          fVar5 = local_48;
        }
        break;
      case 4:
        if (local_40 <= fVar1) goto LAB_0013981e;
        if (fVar5 <= 0.0) {
          *(undefined4 *)((long)puVar2 + 0x2c) = 5;
          fVar5 = local_4c;
        }
        else {
LAB_00139811:
          fVar5 = fVar5 - local_50;
        }
        break;
      case 5:
        if (fVar1 < local_40) {
          if (0.0 < fVar5) {
            fVar4 = fVar5 / local_4c;
            goto LAB_00139811;
          }
          *(undefined4 *)((long)puVar2 + 0x2c) = 1;
          goto LAB_00139861;
        }
        fVar4 = fVar5 / local_4c;
        *(undefined4 *)((long)puVar2 + 0x2c) = 2;
        fVar5 = local_44 * fVar4;
      }
      in[uVar3] = fVar1 * fVar4;
    }
  }
  else {
    mixed_buffer_request_write(&local_30,&samples,buffer_00);
    fVar4 = 1.0;
    for (uVar3 = 0; samples != uVar3; uVar3 = uVar3 + 1) {
      fVar1 = in[uVar3];
      switch(*(undefined4 *)((long)puVar2 + 0x2c)) {
      case 1:
        fVar4 = 0.0;
        if (local_40 <= fVar1) {
          *(undefined4 *)((long)puVar2 + 0x2c) = 2;
LAB_001396ff:
          fVar4 = 0.0;
          fVar5 = 0.0;
        }
        break;
      case 2:
        if (fVar5 <= local_44) {
          fVar4 = fVar5 / local_44;
          fVar5 = fVar5 + local_50;
        }
        else {
LAB_001396bc:
          *(undefined4 *)((long)puVar2 + 0x2c) = 3;
        }
        break;
      case 3:
        if (fVar1 < local_3c) {
          *(undefined4 *)((long)puVar2 + 0x2c) = 4;
          fVar5 = local_48;
        }
        break;
      case 4:
        if (local_40 <= fVar1) goto LAB_001396bc;
        if (fVar5 <= 0.0) {
          *(undefined4 *)((long)puVar2 + 0x2c) = 5;
          fVar5 = local_4c;
        }
        else {
LAB_001396af:
          fVar5 = fVar5 - local_50;
        }
        break;
      case 5:
        if (fVar1 < local_40) {
          if (0.0 < fVar5) {
            fVar4 = fVar5 / local_4c;
            goto LAB_001396af;
          }
          *(undefined4 *)((long)puVar2 + 0x2c) = 1;
          goto LAB_001396ff;
        }
        fVar4 = fVar5 / local_4c;
        *(undefined4 *)((long)puVar2 + 0x2c) = 2;
        fVar5 = local_44 * fVar4;
      }
      local_30[uVar3] = fVar1 * fVar4;
    }
    mixed_buffer_finish_read(samples,buffer);
    mixed_buffer_finish_write(samples,buffer_00);
  }
  *(float *)(puVar2 + 5) = fVar5;
  return 1;
}

Assistant:

VECTORIZE int gate_segment_mix(struct mixed_segment *segment){
  struct gate_segment_data *data = (struct gate_segment_data *)segment->data;

  float stime = 1.0/data->samplerate;
  float time = data->time;
  float open = data->open_threshold;
  float close = data->close_threshold;
  float attack = data->attack;
  float hold = data->hold;
  float release = data->release;
  float volume = 1.0;
  
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float sample = in[i];
      switch(data->state){
      case CLOSED:
        volume = 0.0;
        if(open <= sample){
          time = 0.0;
          data->state = ATTACKING;
        }
        break;
      case ATTACKING:
        if(attack < time){
          data->state = OPEN;
        }else{
          volume = time/attack;
          time += stime;
        }
        break;
      case OPEN:
        if(sample < close){
          time = hold;
          data->state = HOLDING;
        }
        break;
      case HOLDING:
        if(open <= sample){
          data->state = OPEN;
        }else if(time <= 0){
          time = release;
          data->state = RELEASING;
        }else{
          time -= stime;
        }
        break;
      case RELEASING:
        if(open <= sample){
          volume = time/release;
          time = time/release*attack;
          data->state = ATTACKING;
        }else if(time <= 0){
          volume = 0.0;
          time = 0.0;
          data->state = CLOSED;
        }else{
          volume = time/release;
          time -= stime;
        }
        break;
      }
      out[i] = sample * volume;
    })
  data->time = time;
  return 1;
}